

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

Result file_read_aligned(char *filename,size_t align,FileData *out_file_data)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  u8 *__ptr;
  ulong __size;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    file_read_aligned_cold_6();
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 < 0) {
      file_read_aligned_cold_1();
    }
    else {
      sVar2 = ftell(__stream);
      if ((long)sVar2 < 0) {
        file_read_aligned_cold_2();
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 < 0) {
          file_read_aligned_cold_3();
        }
        else {
          __size = -align & (align + sVar2) - 1;
          __ptr = (u8 *)calloc(1,__size);
          if (__ptr == (u8 *)0x0) {
            file_read_aligned_cold_5();
          }
          else {
            sVar2 = fread(__ptr,sVar2,1,__stream);
            if (sVar2 == 1) {
              fclose(__stream);
              out_file_data->data = __ptr;
              out_file_data->size = __size;
              return OK;
            }
            file_read_aligned_cold_4();
          }
        }
      }
    }
    fclose(__stream);
  }
  return ERROR;
}

Assistant:

Result file_read_aligned(const char* filename, size_t align,
                         FileData* out_file_data) {
  FILE* f = fopen(filename, "rb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  long size;
  CHECK(SUCCESS(get_file_size(f, &size)));
  long aligned_size = ALIGN_UP(size, align);
  u8* data = xcalloc(1, aligned_size);
  CHECK_MSG(data, "allocation failed.\n");
  CHECK_MSG(fread(data, size, 1, f) == 1, "fread failed.\n");
  fclose(f);
  out_file_data->data = data;
  out_file_data->size = aligned_size;
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}